

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli.c
# Opt level: O0

int CompressFiles(Context *context)

{
  int iVar1;
  BrotliEncoderState *state;
  uint32_t local_34;
  uint32_t local_2c;
  uint32_t size_hint;
  uint32_t lgwin;
  BrotliEncoderState *s;
  int is_ok;
  Context *context_local;
  
  do {
    iVar1 = NextFile(context);
    if (iVar1 == 0) {
      return 1;
    }
    state = BrotliEncoderCreateInstance((brotli_alloc_func)0x0,(brotli_free_func)0x0,(void *)0x0);
    if (state == (BrotliEncoderState *)0x0) {
      fprintf(_stderr,"out of memory\n");
      return 0;
    }
    BrotliEncoderSetParameter(state,BROTLI_PARAM_QUALITY,context->quality);
    if (context->lgwin < 1) {
      local_2c = 0x18;
      if (-1 < context->input_file_length) {
        local_2c = 10;
        do {
          if ((ulong)context->input_file_length <= (1L << ((byte)local_2c & 0x3f)) - 0x10U) break;
          local_2c = local_2c + 1;
        } while (local_2c != 0x18);
      }
      BrotliEncoderSetParameter(state,BROTLI_PARAM_LGWIN,local_2c);
    }
    else {
      if (0x18 < context->lgwin) {
        BrotliEncoderSetParameter(state,BROTLI_PARAM_LARGE_WINDOW,1);
      }
      BrotliEncoderSetParameter(state,BROTLI_PARAM_LGWIN,context->lgwin);
    }
    if (0 < context->input_file_length) {
      if (context->input_file_length < 0x40000000) {
        local_34 = (uint32_t)context->input_file_length;
      }
      else {
        local_34 = 0x40000000;
      }
      BrotliEncoderSetParameter(state,BROTLI_PARAM_SIZE_HINT,local_34);
    }
    s._4_4_ = OpenFiles(context);
    if ((((s._4_4_ != 0) && (context->current_output_path == (char *)0x0)) &&
        (context->force_overwrite == 0)) && (iVar1 = isatty(1), iVar1 != 0)) {
      fprintf(_stderr,"Use -h help. Use -f to force output to a terminal.\n");
      s._4_4_ = 0;
    }
    if (s._4_4_ != 0) {
      s._4_4_ = CompressFile(context,state);
    }
    BrotliEncoderDestroyInstance(state);
    iVar1 = CloseFiles(context,s._4_4_);
    if (iVar1 == 0) {
      s._4_4_ = 0;
    }
    if (s._4_4_ == 0) {
      return 0;
    }
  } while( true );
}

Assistant:

static BROTLI_BOOL CompressFiles(Context* context) {
  while (NextFile(context)) {
    BROTLI_BOOL is_ok = BROTLI_TRUE;
    BrotliEncoderState* s = BrotliEncoderCreateInstance(NULL, NULL, NULL);
    if (!s) {
      fprintf(stderr, "out of memory\n");
      return BROTLI_FALSE;
    }
    BrotliEncoderSetParameter(s,
        BROTLI_PARAM_QUALITY, (uint32_t)context->quality);
    if (context->lgwin > 0) {
      /* Specified by user. */
      /* Do not enable "large-window" extension, if not required. */
      if (context->lgwin > BROTLI_MAX_WINDOW_BITS) {
        BrotliEncoderSetParameter(s, BROTLI_PARAM_LARGE_WINDOW, 1u);
      }
      BrotliEncoderSetParameter(s,
          BROTLI_PARAM_LGWIN, (uint32_t)context->lgwin);
    } else {
      /* 0, or not specified by user; could be chosen by compressor. */
      uint32_t lgwin = DEFAULT_LGWIN;
      /* Use file size to limit lgwin. */
      if (context->input_file_length >= 0) {
        lgwin = BROTLI_MIN_WINDOW_BITS;
        while (BROTLI_MAX_BACKWARD_LIMIT(lgwin) <
               (uint64_t)context->input_file_length) {
          lgwin++;
          if (lgwin == BROTLI_MAX_WINDOW_BITS) break;
        }
      }
      BrotliEncoderSetParameter(s, BROTLI_PARAM_LGWIN, lgwin);
    }
    if (context->input_file_length > 0) {
      uint32_t size_hint = context->input_file_length < (1 << 30) ?
          (uint32_t)context->input_file_length : (1u << 30);
      BrotliEncoderSetParameter(s, BROTLI_PARAM_SIZE_HINT, size_hint);
    }
    is_ok = OpenFiles(context);
    if (is_ok && !context->current_output_path &&
        !context->force_overwrite && isatty(STDOUT_FILENO)) {
      fprintf(stderr, "Use -h help. Use -f to force output to a terminal.\n");
      is_ok = BROTLI_FALSE;
    }
    if (is_ok) is_ok = CompressFile(context, s);
    BrotliEncoderDestroyInstance(s);
    if (!CloseFiles(context, is_ok)) is_ok = BROTLI_FALSE;
    if (!is_ok) return BROTLI_FALSE;
  }
  return BROTLI_TRUE;
}